

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

bool __thiscall
CLI::App::_parse_subcommand
          (App *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer *ppbVar1;
  pointer *pppAVar2;
  pointer puVar3;
  Option *pOVar4;
  size_t __n;
  pointer pcVar5;
  pointer pbVar6;
  iterator iVar7;
  App *this_00;
  Option_p *opt;
  pointer puVar8;
  void *pvVar9;
  HorribleError *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  long lVar12;
  uint uVar13;
  long lVar14;
  size_type __n_00;
  bool bVar15;
  App *com;
  App *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  puVar8 = (this->options_).
           super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (this->options_).
           super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar8 != puVar3) {
    lVar12 = 0;
    do {
      pOVar4 = (puVar8->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
               _M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
               super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      if (((((pOVar4->pname_)._M_string_length != 0) &&
           ((pOVar4->super_OptionBase<CLI::Option>).required_ == true)) &&
          (uVar13 = pOVar4->expected_min_ * pOVar4->type_size_min_, 0 < (int)uVar13)) &&
         (lVar14 = (long)*(pointer *)
                          ((long)&(pOVar4->results_).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          + 8) -
                   *(long *)&(pOVar4->results_).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl >> 5, (int)lVar14 < (int)uVar13)) {
        lVar12 = (lVar12 + (ulong)uVar13) - lVar14;
      }
      puVar8 = puVar8 + 1;
    } while (puVar8 != puVar3);
    if (lVar12 != 0) {
      _parse_positional(this,args,false);
      return true;
    }
  }
  ppbVar1 = &(args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  local_78 = _find_subcommand(this,(args->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish + -1,true,true);
  if (local_78 == (App *)0x0) {
    __n = (*ppbVar1)[-1]._M_string_length;
    pbVar10 = *ppbVar1 + -1;
    if (__n == 0) {
      __n_00 = 0xffffffffffffffff;
    }
    else {
      pcVar5 = (pbVar10->_M_dataplus)._M_p;
      pvVar9 = memchr(pcVar5,0x2e,__n);
      __n_00 = -(ulong)(pvVar9 == (void *)0x0) | (long)pvVar9 - (long)pcVar5;
    }
    if (__n_00 != 0xffffffffffffffff) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_70,pbVar10,0,__n_00);
      local_78 = _find_subcommand(this,&local_70,true,true);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if (local_78 != (App *)0x0) {
        _parse_subcommand();
        get_display_name_abi_cxx11_(&local_70,local_78,false);
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)args,
                   &local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
      }
    }
  }
  bVar15 = local_78 == (App *)0x0;
  if (bVar15) {
    if (this->parent_ == (App *)0x0) {
      this_01 = (HorribleError *)__cxa_allocate_exception(0x38);
      ::std::operator+(&local_70,"Subcommand ",*ppbVar1 + -1);
      pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append(&local_70," missing");
      local_50._M_dataplus._M_p = (pbVar10->_M_dataplus)._M_p;
      paVar11 = &pbVar10->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p == paVar11) {
        local_50.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_50.field_2._8_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      }
      else {
        local_50.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
      }
      local_50._M_string_length = pbVar10->_M_string_length;
      (pbVar10->_M_dataplus)._M_p = (pointer)paVar11;
      pbVar10->_M_string_length = 0;
      (pbVar10->field_2)._M_local_buf[0] = '\0';
      HorribleError::HorribleError(this_01,&local_50);
      __cxa_throw(this_01,&HorribleError::typeinfo,Error::~Error);
    }
  }
  else {
    pbVar6 = *ppbVar1;
    *ppbVar1 = pbVar6 + -1;
    pcVar5 = pbVar6[-1]._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar5 != &pbVar6[-1].field_2) {
      operator_delete(pcVar5,pbVar6[-1].field_2._M_allocated_capacity + 1);
    }
    if (local_78->silent_ == false) {
      iVar7._M_current =
           (this->parsed_subcommands_).super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar7._M_current ==
          (this->parsed_subcommands_).super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<CLI::App*,std::allocator<CLI::App*>>::_M_realloc_insert<CLI::App*const&>
                  ((vector<CLI::App*,std::allocator<CLI::App*>> *)&this->parsed_subcommands_,iVar7,
                   &local_78);
      }
      else {
        *iVar7._M_current = local_78;
        pppAVar2 = &(this->parsed_subcommands_).
                    super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppAVar2 = *pppAVar2 + 1;
      }
    }
    _parse(local_78,args);
    for (this_00 = local_78->parent_; this_00 != this; this_00 = this_00->parent_) {
      _trigger_pre_parse(this_00,(long)(args->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(args->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start >> 5);
      if (local_78->silent_ == false) {
        iVar7._M_current =
             (this_00->parsed_subcommands_).
             super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar7._M_current ==
            (this_00->parsed_subcommands_).
            super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          ::std::vector<CLI::App*,std::allocator<CLI::App*>>::_M_realloc_insert<CLI::App*const&>
                    ((vector<CLI::App*,std::allocator<CLI::App*>> *)&this_00->parsed_subcommands_,
                     iVar7,&local_78);
        }
        else {
          *iVar7._M_current = local_78;
          pppAVar2 = &(this_00->parsed_subcommands_).
                      super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          *pppAVar2 = *pppAVar2 + 1;
        }
      }
    }
  }
  return !bVar15;
}

Assistant:

CLI11_INLINE bool App::_parse_subcommand(std::vector<std::string> &args) {
    if(_count_remaining_positionals(/* required */ true) > 0) {
        _parse_positional(args, false);
        return true;
    }
    auto *com = _find_subcommand(args.back(), true, true);
    if(com == nullptr) {
        // the main way to get here is using .notation
        auto dotloc = args.back().find_first_of('.');
        if(dotloc != std::string::npos) {
            com = _find_subcommand(args.back().substr(0, dotloc), true, true);
            if(com != nullptr) {
                args.back() = args.back().substr(dotloc + 1);
                args.push_back(com->get_display_name());
            }
        }
    }
    if(com != nullptr) {
        args.pop_back();
        if(!com->silent_) {
            parsed_subcommands_.push_back(com);
        }
        com->_parse(args);
        auto *parent_app = com->parent_;
        while(parent_app != this) {
            parent_app->_trigger_pre_parse(args.size());
            if(!com->silent_) {
                parent_app->parsed_subcommands_.push_back(com);
            }
            parent_app = parent_app->parent_;
        }
        return true;
    }

    if(parent_ == nullptr)
        throw HorribleError("Subcommand " + args.back() + " missing");
    return false;
}